

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O2

char * __thiscall
XPMP2::SoundSystem::EnumerateSounds(SoundSystem *this,char *prevName,char **ppFilePath)

{
  iterator iVar1;
  allocator<char> local_41;
  key_type local_40;
  
  if (ppFilePath != (char **)0x0) {
    *ppFilePath = (char *)0x0;
  }
  if ((this->mapSounds)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    if ((prevName == (char *)0x0) || (*prevName == '\0')) {
      iVar1._M_node = (this->mapSounds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,prevName,&local_41);
      iVar1 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>_>_>_>
              ::find(&(this->mapSounds)._M_t,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      if ((_Rb_tree_header *)iVar1._M_node != &(this->mapSounds)._M_t._M_impl.super__Rb_tree_header)
      {
        iVar1._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar1._M_node);
      }
    }
    if ((_Rb_tree_header *)iVar1._M_node != &(this->mapSounds)._M_t._M_impl.super__Rb_tree_header) {
      if ((ppFilePath != (char **)0x0) && (*(long *)(iVar1._M_node + 2) != 0)) {
        *ppFilePath = *(char **)(*(long *)(iVar1._M_node + 2) + 0x10);
      }
      return *(char **)(iVar1._M_node + 1);
    }
  }
  return (char *)0x0;
}

Assistant:

const char* SoundSystem::EnumerateSounds (const char* prevName, const char** ppFilePath)
{
    if (ppFilePath) *ppFilePath = nullptr;

    // No sounds available at all?
    if (mapSounds.empty())
        return nullptr;
    
    auto sndIter = mapSounds.end();
    // Return first sound?
    if (!prevName || !prevName[0])
        sndIter = mapSounds.begin();
    else {
        // Try finding the given `prevName` sound, then return next
        sndIter = mapSounds.find(prevName);
        if (sndIter != mapSounds.end())
            sndIter++;
    }
    
    // Not found anything anymore?
    if (sndIter == mapSounds.end()) {
        return nullptr;
    } else {
        // Return the found element
        if (ppFilePath && sndIter->second)
            *ppFilePath = sndIter->second->filePath.c_str();
        return sndIter->first.c_str();
    }
}